

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1156.c
# Opt level: O0

int test(char *URL)

{
  int iVar1;
  uint uVar2;
  CURL *curl_00;
  uint local_34;
  ulong uStack_30;
  int status;
  size_t i;
  CURL *curl;
  CURLcode res;
  char *URL_local;
  
  local_34 = 0;
  iVar1 = curl_global_init(3);
  if (iVar1 == 0) {
    curl_00 = (CURL *)curl_easy_init();
    if (curl_00 == (CURL *)0x0) {
      curl_mfprintf(_stderr,"curl_easy_init() failed\n");
      curl_global_cleanup();
      URL_local._4_4_ = 0x7e;
    }
    else {
      URL_local._4_4_ = curl_easy_setopt(curl_00,0x4e2b,writedata);
      if (URL_local._4_4_ == 0) {
        for (uStack_30 = 0; uStack_30 < 0x10; uStack_30 = uStack_30 + 1) {
          uVar2 = onetest(curl_00,URL,params + uStack_30);
          local_34 = uVar2 | local_34;
        }
        curl_easy_cleanup(curl_00);
        curl_global_cleanup();
        URL_local._4_4_ = local_34;
      }
      else {
        curl_easy_cleanup(curl_00);
        curl_global_cleanup();
      }
    }
  }
  else {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    URL_local._4_4_ = 0x7e;
  }
  return URL_local._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLcode res;
  CURL *curl;
  size_t i;
  int status = 0;

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  test_setopt(curl, CURLOPT_WRITEFUNCTION, writedata);

  for(i = 0; i < sizeof(params) / sizeof(params[0]); i++)
    status |= onetest(curl, URL, params + i);

  curl_easy_cleanup(curl);
  curl_global_cleanup();
  return status;

  test_cleanup:

  curl_easy_cleanup(curl);
  curl_global_cleanup();

  return (int)res;
}